

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree_node.h
# Opt level: O1

int __thiscall
data_structures::
RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>::
_init(RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      *this,EVP_PKEY_CTX *ctx)

{
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar1;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar2;
  int iVar3;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node_1;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> TStack_58;
  
  this->_left = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 *)0x0;
  this->_right = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                  *)0x0;
  this->_parent =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&TStack_58.value);
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::operator=
            (&this->element,&TStack_58);
  TStack_58.value._vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010d988;
  TStack_58.value._table._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010d9b8;
  while (pLVar2 = TStack_58.value._table._list._header,
        TStack_58.value._table._list._header != TStack_58.value._table._list._tail) {
    pLVar1 = (TStack_58.value._table._list._header)->_next;
    if (pLVar1 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      (TStack_58.value._table._list._header)->_next = pLVar1->_next;
      (*pLVar1->_vptr_ListNode[1])(pLVar1);
    }
    if (pLVar1 == TStack_58.value._table._list._tail) {
      TStack_58.value._table._list._tail = pLVar2;
    }
    TStack_58.value._table._list._size = TStack_58.value._table._list._size - 1;
  }
  iVar3 = 0x10d9e8;
  TStack_58.value._table._list._size = 0;
  TStack_58.value._table._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010d9e8;
  if (TStack_58.value._table._list._header !=
      (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
       *)0x0) {
    iVar3 = (*(TStack_58.value._table._list._header)->_vptr_ListNode[1])
                      (TStack_58.value._table._list._header);
  }
  this->node_count = 1;
  this->_is_left = false;
  this->_is_red = false;
  return iVar3;
}

Assistant:

inline
    void RBTreeNode<T>::_init() {
        _left = nullptr;
        _right = nullptr;
        _parent = nullptr;
        element = T();
        node_count = 1;
        _is_left = false;
        _is_red = false;
    }